

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::ArrayNames::Run(ArrayNames *this)

{
  GLuint GVar1;
  uint uVar2;
  char *src_vs;
  char *src_fs;
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  long local_70;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  ArrayNames *pAStack_10;
  GLuint program;
  ArrayNames *this_local;
  
  pAStack_10 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  local_14 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar1,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  GVar1 = local_14;
  local_70 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"a",&local_91);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_14,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_90,(ulong)uVar2,&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"a[0]",&local_b9);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_14,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_b8,(ulong)uVar2,&local_70);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"a[1]",&local_e1);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_14,"a[1]");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_e0,(ulong)uVar2,&local_70);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"a[2]",&local_109);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_108,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"a[0 + 0]",&local_131);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_130,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"a[0+0]",&local_159);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_158,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"a[ 0]",&local_181);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_180,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"a[0 ]",&local_1a9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_1a8,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"a[\n0]",&local_1d1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_1d0,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"a[\t0]",&local_1f9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_1f8,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"a[01]",&local_221);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_220,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"a[00]",&local_249);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e1,local_248,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14);
  return local_70;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0]", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[1]", glGetUniformLocation(program, "a[1]"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[2]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0 + 0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0+0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[ 0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0 ]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[\n0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[\t0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[01]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[00]", -1, error);

		glDeleteProgram(program);
		return error;
	}